

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manual-optimizer.cpp
# Opt level: O0

result * baryonyx::itm::manual_optimize(result *__return_storage_ptr__,context *ctx,problem *pb)

{
  problem *pb_local;
  context *ctx_local;
  
  notice<>(ctx,"- auto-tune parameters (manual) starts\n");
  ::optimize(__return_storage_ptr__,ctx,pb);
  return __return_storage_ptr__;
}

Assistant:

result
manual_optimize(const baryonyx::context& ctx, const baryonyx::problem& pb)
{
    baryonyx::notice(ctx, "- auto-tune parameters (manual) starts\n");
    return ::optimize(ctx, pb);
}